

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O0

void __thiscall rapic::client::disconnect(client *this)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x68) != -1) {
    close(*(int *)(in_RDI + 0x68));
  }
  *(undefined4 *)(in_RDI + 0x68) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x6c) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  std::__cxx11::string::clear();
  return;
}

Assistant:

auto client::disconnect() -> void
{
  if (socket_ != -1)
    close(socket_);
  socket_ = -1;
  state_ = rapic::connection_state::disconnected;
  last_keepalive_ = 0;
  wbuffer_.clear();
}